

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O0

void WI_drawDeathmatchStats(void)

{
  FFont *pFVar1;
  DFrameBuffer *pDVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  EColorRange EVar8;
  FTexture *this;
  char *pcVar9;
  char *str;
  char *string;
  FTexture *img;
  char local_10d [8];
  char timer [9];
  FString local_f8;
  FString leveltime;
  int minutes;
  int hours;
  int seconds;
  FTexture *pic;
  player_t *local_d0;
  player_t *player;
  player_t *sortedplayers [8];
  FTexture *readyico;
  char *text_frags;
  char *text_deaths;
  float local_60;
  EColorRange color;
  float b;
  float g;
  float r;
  float v;
  float s;
  float h;
  int deaths_len;
  int deaths_x;
  int frags_x;
  int name_x;
  int icon_x;
  int pwidth;
  int maxiconheight;
  int maxscorewidth;
  int maxnamewidth;
  int lineheight;
  int height;
  int ypadding;
  int y;
  int x;
  int pnum;
  int i;
  
  name_x = (*IntermissionFont->_vptr_FFont[3])(IntermissionFont,0x25);
  this = FTextureManager::FindTexture(&TexMan,"READYICO",8,1);
  WI_drawBackground();
  height = WI_drawLF();
  HU_GetPlayerWidths(&maxiconheight,&pwidth,&icon_x);
  iVar4 = FTexture::GetScaledHeight(this);
  iVar5 = FTexture::GetScaledTopOffset(this);
  maxnamewidth = iVar4 - iVar5;
  icon_x = MAX<int>(maxnamewidth,icon_x);
  iVar4 = FFont::GetHeight(SmallFont);
  maxnamewidth = iVar4 * CleanYfac;
  maxscorewidth = MAX<int>(maxnamewidth,icon_x * CleanYfac);
  lineheight = ((maxscorewidth - maxnamewidth) + 1) / 2;
  height = CleanYfac + height;
  pcVar9 = FStringTable::operator()(&GStrings,"SCORE_DEATHS");
  str = FStringTable::operator()(&GStrings,"SCORE_FRAGS");
  frags_x = CleanXfac * 8;
  iVar6 = frags_x + pwidth * CleanXfac;
  deaths_x = iVar6;
  iVar4 = FFont::StringWidth(SmallFont,"XXXXX");
  iVar5 = FFont::StringWidth(SmallFont,str);
  iVar4 = MAX<int>(iVar4,iVar5);
  iVar6 = iVar6 + (maxiconheight + iVar4 + 8) * CleanXfac;
  deaths_len = iVar6;
  s = (float)FFont::StringWidth(SmallFont,pcVar9);
  h = (float)(iVar6 + ((int)s + 8) * CleanXfac);
  iVar5 = DCanvas::GetWidth((DCanvas *)screen);
  iVar4 = height;
  pDVar2 = screen;
  pFVar1 = SmallFont;
  ypadding = iVar5 - (int)h >> 1;
  frags_x = ypadding + frags_x;
  iVar5 = ypadding + deaths_x;
  deaths_len = ypadding + deaths_len;
  h = (float)(ypadding + (int)h);
  iVar6 = 0xb;
  if ((gameinfo.gametype & GAME_Raven) != GAME_Any) {
    iVar6 = 3;
  }
  deaths_x = iVar5;
  string = FStringTable::operator()(&GStrings,"SCORE_NAME");
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,iVar6,iVar5,iVar4,string,0x40001393,1,0);
  iVar4 = deaths_len;
  pDVar2 = screen;
  pFVar1 = SmallFont;
  iVar5 = FFont::StringWidth(SmallFont,str);
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,iVar6,iVar4 - iVar5 * CleanXfac,height,str,0x40001393,1
                    ,0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar6,(int)h - (int)s * CleanXfac,height,pcVar9,
                    0x40001393,1,0);
  height = maxnamewidth + CleanYfac * 6 + height;
  for (x = 0; x < 8; x = x + 1) {
    sortedplayers[(long)x + -1] = (player_t *)(&players + (long)x * 0x54);
  }
  bVar3 = FBoolCVar::operator_cast_to_bool(&teamplay);
  if (bVar3) {
    qsort(&player,8,8,compareteams);
  }
  else {
    qsort(&player,8,8,comparepoints);
  }
  for (x = 0; iVar4 = deaths_x, pDVar2 = screen, pFVar1 = SmallFont, x < 8; x = x + 1) {
    local_d0 = sortedplayers[(long)x + -1];
    y = (int)((long)(local_d0[-0xa3fb].weapons.Slots + 4) / 0x2a0);
    if ((playeringame[y] & 1U) != 0) {
      D_GetPlayerColor(y,&v,&r,&g,(FPlayerColorSet **)0x0);
      HSVtoRGB(&b,(float *)&color,&local_60,v,r,g);
      pDVar2 = screen;
      iVar4 = clamp<int>((int)(b * 255.0),0,0xff);
      iVar5 = clamp<int>((int)((float)color * 255.0),0,0xff);
      uVar7 = clamp<int>((int)(local_60 * 255.0),0,0xff);
      PalEntry::PalEntry((PalEntry *)((long)&pic + 4),iVar4 << 0x10 | iVar5 << 8 | uVar7);
      (*(pDVar2->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xe])
                (0x3f4ccccd,pDVar2,(ulong)pic._4_4_,(ulong)(uint)ypadding,
                 (ulong)(uint)(height - lineheight),
                 (ulong)(uint)(((int)h - ypadding) + CleanXfac * 8),(ulong)(uint)maxscorewidth);
      if (((playerready[y] & 1U) != 0) ||
         (bVar3 = TObjPtr<DBot>::operator!=(&local_d0->Bot,(DBot *)0x0), bVar3)) {
        iVar4 = ypadding;
        pDVar2 = screen;
        iVar5 = FTexture::GetWidth(this);
        DCanvas::DrawTexture
                  ((DCanvas *)pDVar2,this,(double)(iVar4 - iVar5 * CleanXfac),(double)height,
                   0x40001393,1,0);
      }
      EVar8 = HU_GetRowColor(local_d0,y == consoleplayer);
      bVar3 = FTextureID::isValid(&local_d0->mo->ScoreIcon);
      if (bVar3) {
        img = FTextureManager::operator[](&TexMan,(FTextureID)(local_d0->mo->ScoreIcon).texnum);
        DCanvas::DrawTexture((DCanvas *)screen,img,(double)frags_x,(double)height,0x40001393,1,0);
      }
      iVar4 = deaths_x;
      pDVar2 = screen;
      pFVar1 = SmallFont;
      iVar5 = height + lineheight;
      pcVar9 = userinfo_t::GetName(&local_d0->userinfo);
      DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,EVar8,iVar4,iVar5,pcVar9,0x40001393,1,0);
      WI_drawNum(SmallFont,deaths_len,height + lineheight,cnt_frags[y],0,false,EVar8);
      if (1 < ng_state) {
        WI_drawNum(SmallFont,(int)h,height + lineheight,cnt_deaths[y],0,false,EVar8);
      }
      height = maxscorewidth + CleanYfac + height;
    }
  }
  iVar5 = maxnamewidth + CleanYfac * 3 + height;
  EVar8 = CR_UNTRANSLATED;
  if ((gameinfo.gametype & GAME_Raven) != GAME_Any) {
    EVar8 = CR_GREEN;
  }
  height = iVar5;
  pcVar9 = FStringTable::operator()(&GStrings,"SCORE_TOTAL");
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,EVar8,iVar4,iVar5,pcVar9,0x40001393,1,0);
  WI_drawNum(SmallFont,deaths_len,height,total_frags,0,false,EVar8);
  if (3 < ng_state) {
    WI_drawNum(SmallFont,(int)h,height,total_deaths,0,false,EVar8);
  }
  height = height + maxnamewidth + CleanYfac;
  iVar4 = Tics2Seconds(plrs[me].stime);
  leveltime.Chars._4_4_ = iVar4 / 0xe10;
  leveltime.Chars._0_4_ = (iVar4 % 0xe10) / 0x3c;
  pcVar9 = FStringTable::operator()(&GStrings,"SCORE_LVLTIME");
  FString::FString(&local_f8,pcVar9);
  FString::operator+=(&local_f8,": ");
  mysnprintf(local_10d,9,"%02i:%02i:%02i",(ulong)leveltime.Chars._4_4_,(ulong)(uint)leveltime.Chars,
             (ulong)(uint)(iVar4 % 0x3c));
  FString::operator+=(&local_f8,local_10d);
  iVar5 = ypadding;
  iVar4 = height;
  pDVar2 = screen;
  pFVar1 = SmallFont;
  pcVar9 = FString::operator_cast_to_char_(&local_f8);
  DCanvas::DrawText((DCanvas *)pDVar2,pFVar1,EVar8,iVar5,iVar4,pcVar9,0x40001393,1,0);
  FString::~FString(&local_f8);
  return;
}

Assistant:

void WI_drawDeathmatchStats ()
{
	int i, pnum, x, y, ypadding, height, lineheight;
	int maxnamewidth, maxscorewidth, maxiconheight;
	int pwidth = IntermissionFont->GetCharWidth('%');
	int icon_x, name_x, frags_x, deaths_x;
	int deaths_len;
	float h, s, v, r, g, b;
	EColorRange color;
	const char *text_deaths, *text_frags;
	FTexture *readyico = TexMan.FindTexture("READYICO");
	player_t *sortedplayers[MAXPLAYERS];

	// draw animated background
	WI_drawBackground();

	y = WI_drawLF();

	HU_GetPlayerWidths(maxnamewidth, maxscorewidth, maxiconheight);
	// Use the readyico height if it's bigger.
	height = readyico->GetScaledHeight() - readyico->GetScaledTopOffset();
	maxiconheight = MAX(height, maxiconheight);
	height = SmallFont->GetHeight() * CleanYfac;
	lineheight = MAX(height, maxiconheight * CleanYfac);
	ypadding = (lineheight - height + 1) / 2;
	y += CleanYfac;

	text_deaths = GStrings("SCORE_DEATHS");
	//text_color = GStrings("SCORE_COLOR");
	text_frags = GStrings("SCORE_FRAGS");

	icon_x = 8 * CleanXfac;
	name_x = icon_x + maxscorewidth * CleanXfac;
	frags_x = name_x + (maxnamewidth + MAX(SmallFont->StringWidth("XXXXX"), SmallFont->StringWidth(text_frags)) + 8) * CleanXfac;
	deaths_x = frags_x + ((deaths_len = SmallFont->StringWidth(text_deaths)) + 8) * CleanXfac;

	x = (SCREENWIDTH - deaths_x) >> 1;
	icon_x += x;
	name_x += x;
	frags_x += x;
	deaths_x += x;

	color = (gameinfo.gametype & GAME_Raven) ? CR_GREEN : CR_UNTRANSLATED;

	screen->DrawText(SmallFont, color, name_x, y, GStrings("SCORE_NAME"), DTA_CleanNoMove, true, TAG_DONE);
	screen->DrawText(SmallFont, color, frags_x - SmallFont->StringWidth(text_frags)*CleanXfac, y, text_frags, DTA_CleanNoMove, true, TAG_DONE);
	screen->DrawText(SmallFont, color, deaths_x - deaths_len*CleanXfac, y, text_deaths, DTA_CleanNoMove, true, TAG_DONE);
	y += height + 6 * CleanYfac;

	// Sort all players
	for (i = 0; i < MAXPLAYERS; i++)
	{
		sortedplayers[i] = &players[i];
	}

	if (teamplay)
		qsort(sortedplayers, MAXPLAYERS, sizeof(player_t *), compareteams);
	else
		qsort(sortedplayers, MAXPLAYERS, sizeof(player_t *), comparepoints);

	// Draw lines for each player
	for (i = 0; i < MAXPLAYERS; i++)
	{
		player_t *player = sortedplayers[i];
		pnum = int(player - players);

		if (!playeringame[pnum])
			continue;

		D_GetPlayerColor(pnum, &h, &s, &v, NULL);
		HSVtoRGB(&r, &g, &b, h, s, v);

		screen->Dim(MAKERGB(clamp(int(r*255.f), 0, 255), 
			clamp(int(g*255.f), 0, 255), 
			clamp(int(b*255.f), 0, 255)), 0.8f, x, y - ypadding, (deaths_x - x) + (8 * CleanXfac), lineheight);

		if (playerready[pnum] || player->Bot != NULL) // Bots are automatically assumed ready, to prevent confusion
			screen->DrawTexture(readyico, x - (readyico->GetWidth() * CleanXfac), y, DTA_CleanNoMove, true, TAG_DONE);

		color = (EColorRange)HU_GetRowColor(player, pnum == consoleplayer);
		if (player->mo->ScoreIcon.isValid())
		{
			FTexture *pic = TexMan[player->mo->ScoreIcon];
			screen->DrawTexture(pic, icon_x, y, DTA_CleanNoMove, true, TAG_DONE);
		}
		screen->DrawText(SmallFont, color, name_x, y + ypadding, player->userinfo.GetName(), DTA_CleanNoMove, true, TAG_DONE);
		WI_drawNum(SmallFont, frags_x, y + ypadding, cnt_frags[pnum], 0, false, color);
		if (ng_state >= 2)
		{
			WI_drawNum(SmallFont, deaths_x, y + ypadding, cnt_deaths[pnum], 0, false, color);
		}
		y += lineheight + CleanYfac;
	}

	// Draw "TOTAL" line
	y += height + 3 * CleanYfac;
	color = (gameinfo.gametype & GAME_Raven) ? CR_GREEN : CR_UNTRANSLATED;
	screen->DrawText(SmallFont, color, name_x, y, GStrings("SCORE_TOTAL"), DTA_CleanNoMove, true, TAG_DONE);
	WI_drawNum(SmallFont, frags_x, y, total_frags, 0, false, color);
	if (ng_state >= 4)
	{
		WI_drawNum(SmallFont, deaths_x, y, total_deaths, 0, false, color);
	}

	// Draw game time
	y += height + CleanYfac;

	int seconds = Tics2Seconds(plrs[me].stime);
	int hours = seconds / 3600;
	int minutes = (seconds % 3600) / 60;
	seconds = seconds % 60;

	FString leveltime = GStrings("SCORE_LVLTIME");
	leveltime += ": ";

	char timer[sizeof "HH:MM:SS"];
	mysnprintf(timer, sizeof(timer), "%02i:%02i:%02i", hours, minutes, seconds);
	leveltime += timer;

	screen->DrawText(SmallFont, color, x, y, leveltime, DTA_CleanNoMove, true, TAG_DONE);
}